

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

int __thiscall PInt::GetLoadOp(PInt *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = *(int *)&this->field_0x24;
  if (iVar3 == 4) {
    return 0xb;
  }
  if (iVar3 == 2) {
    cVar1 = this->Unsigned;
    iVar3 = 0xf;
    iVar2 = 9;
  }
  else {
    if (iVar3 != 1) {
      __assert_fail("0 && \"Unhandled integer size\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,1099,"virtual int PInt::GetLoadOp() const");
    }
    cVar1 = this->Unsigned;
    iVar3 = 0xd;
    iVar2 = 7;
  }
  if (cVar1 != '\0') {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

int PInt::GetLoadOp() const
{
	if (Size == 4)
	{
		return OP_LW;
	}
	else if (Size == 1)
	{
		return Unsigned ? OP_LBU : OP_LB;
	}
	else if (Size == 2)
	{
		return Unsigned ? OP_LHU : OP_LH;
	}
	else
	{
		assert(0 && "Unhandled integer size");
		return OP_NOP;
	}
}